

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

InvalidFormatAsStopSequenceException * __thiscall
InvalidFormatAsStopSequenceException::Message_abi_cxx11_(InvalidFormatAsStopSequenceException *this)

{
  ostream *poVar1;
  long in_RSI;
  BmsWord local_1d0 [12];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  InvalidFormatAsStopSequenceException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Wrong STOP Value found: ");
  BmsWord::ToString_abi_cxx11_(local_1d0);
  poVar1 = std::operator<<(poVar1,(string *)local_1d0);
  poVar1 = std::operator<<(poVar1," = ");
  std::operator<<(poVar1,(string *)(in_RSI + 0x10));
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
InvalidFormatAsStopSequenceException::Message(void) const
{
	std::stringstream ss;
	ss << "Wrong STOP Value found: " << word.ToString() << " = " << value;
	return ss.str();
}